

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O1

DArray<int> * __thiscall
Lib::DArray<int>::fromIterator<Lib::IterTraits<Lib::RangeIterator<int>>>
          (DArray<int> *__return_storage_ptr__,DArray<int> *this,
          IterTraits<Lib::RangeIterator<int>_> it,size_t count)

{
  int iVar1;
  size_t count_00;
  int iVar2;
  IterTraits<Lib::RangeIterator<int>_> it_00;
  
  count_00 = CONCAT44((int)((ulong)register0x00000008 >> 0x20),it._iter._to);
  __return_storage_ptr__->_size = 0;
  __return_storage_ptr__->_capacity = 0;
  __return_storage_ptr__->_array = (int *)0x0;
  it_00._iter._to = it._iter._next;
  if (count_00 == 0) {
    iVar1 = (int)((ulong)this >> 0x20);
    iVar2 = it_00._iter._to - iVar1;
    if (iVar2 == 0 || it_00._iter._to < iVar1) {
      iVar2 = 0;
    }
    count_00 = (size_t)iVar2;
  }
  it_00._iter._0_8_ = this;
  initFromIterator<Lib::IterTraits<Lib::RangeIterator<int>>>(__return_storage_ptr__,it_00,count_00);
  return __return_storage_ptr__;
}

Assistant:

static DArray fromIterator(It it, size_t count=0) {
    DArray out;
    if (count != 0) {
      out.initFromIterator(it, count);
    } else if (it.knowsSize()) {
      out.initFromIterator(it, it.size());
    } else {
      out.initFromIterator(it);
    }
    return out;
  }